

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_resume_wrapper(intptr_t uuid,fio_protocol_s *p_,void *arg)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = *(long **)((long)arg + 8);
  plVar1[0xf] = *(long *)((long)arg + 0x10);
  lVar2 = *plVar1;
  if (*(code **)((long)arg + 0x18) != (code *)0x0) {
    (**(code **)((long)arg + 0x18))(plVar1);
  }
  (**(code **)(lVar2 + 0x40))(plVar1,p_);
  fio_free(arg);
  return;
}

Assistant:

static void http_resume_wrapper(intptr_t uuid, fio_protocol_s *p_, void *arg) {
  http_fio_protocol_s *p = (http_fio_protocol_s *)p_;
  http_pause_handle_s *http = arg;
  http_s *h = http->h;
  h->udata = http->udata;
  http_vtable_s *vtbl = (http_vtable_s *)h->private_data.vtbl;
  if (http->task)
    http->task(h);
  vtbl->http_on_resume(h, p);
  fio_free(http);
  (void)uuid;
}